

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall sznet::net::EventLoop::loop(EventLoop *this)

{
  char *pcVar1;
  Poller *pPVar2;
  pointer ppCVar3;
  Channel *this_00;
  bool bVar4;
  LogStream *pLVar5;
  char **ppcVar6;
  Timestamp now;
  undefined8 uVar7;
  pointer ppCVar8;
  ChannelList *__range3;
  SourceFile file;
  SourceFile file_00;
  Logger local_1000;
  
  if (this->m_looping != true) {
    bVar4 = isInLoopThread(this);
    if (!bVar4) {
      abortNotInLoopThread(this);
    }
    this->m_looping = true;
    LOCK();
    (this->m_quit)._M_base._M_i = false;
    UNLOCK();
    if (g_logLevel < 1) {
      file._8_8_ = 0xd;
      file.m_data = "EventLoop.cpp";
      Logger::Logger(&local_1000,file,0x5d,TRACE,"loop");
      if (10 < (uint)((int)&local_1000.m_impl.m_stream.m_buffer.m_cur -
                     (int)local_1000.m_impl.m_stream.m_buffer.m_cur)) {
        builtin_strncpy(local_1000.m_impl.m_stream.m_buffer.m_cur,"EventLoop ",10);
        local_1000.m_impl.m_stream.m_buffer.m_cur = local_1000.m_impl.m_stream.m_buffer.m_cur + 10;
      }
      pLVar5 = LogStream::operator<<(&local_1000.m_impl.m_stream,this);
      pcVar1 = (pLVar5->m_buffer).m_cur;
      ppcVar6 = &(pLVar5->m_buffer).m_cur;
      if (0xe < (uint)((int)ppcVar6 - (int)pcVar1)) {
        builtin_strncpy(pcVar1," start looping",0xe);
        *ppcVar6 = *ppcVar6 + 0xe;
      }
      Logger::~Logger(&local_1000);
    }
    if (((this->m_quit)._M_base._M_i & 1U) == 0) {
      do {
        ppCVar8 = (this->m_activeChannels).
                  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((this->m_activeChannels).
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppCVar8) {
          (this->m_activeChannels).
          super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppCVar8;
        }
        now = Timestamp::now();
        (this->m_pollTime).m_microSecondsSinceEpoch = now.m_microSecondsSinceEpoch;
        TimerQueue::expiredProcess
                  ((this->m_timerQueue)._M_t.
                   super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>
                   .super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl,now);
        pPVar2 = (this->m_poller)._M_t.
                 super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>
                 .super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl;
        uVar7 = 0;
        if ((((this->m_timerQueue)._M_t.
              super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>._M_t
              .super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>.
              super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl)->m_activeTimers)._M_t.
            _M_impl.super__Rb_tree_header._M_node_count == 0) {
          uVar7 = 10000;
        }
        (*pPVar2->_vptr_Poller[2])(pPVar2,&this->m_activeChannels,uVar7);
        this->m_iteration = this->m_iteration + 1;
        if (g_logLevel < 1) {
          printActiveChannels(this);
        }
        this->m_eventHandling = true;
        ppCVar3 = (this->m_activeChannels).
                  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar8 = (this->m_activeChannels).
                       super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppCVar8 != ppCVar3;
            ppCVar8 = ppCVar8 + 1) {
          this_00 = *ppCVar8;
          this->m_currentActiveChannel = this_00;
          Channel::handleEvent(this_00,(Timestamp)(this->m_pollTime).m_microSecondsSinceEpoch);
        }
        this->m_currentActiveChannel = (Channel *)0x0;
        this->m_eventHandling = false;
        doPendingFunctors(this);
      } while (((this->m_quit)._M_base._M_i & 1U) == 0);
    }
    if (g_logLevel < 1) {
      file_00._8_8_ = 0xd;
      file_00.m_data = "EventLoop.cpp";
      Logger::Logger(&local_1000,file_00,0x7b,TRACE,"loop");
      if (10 < (uint)((int)&local_1000.m_impl.m_stream.m_buffer.m_cur -
                     (int)local_1000.m_impl.m_stream.m_buffer.m_cur)) {
        builtin_strncpy(local_1000.m_impl.m_stream.m_buffer.m_cur,"EventLoop ",10);
        local_1000.m_impl.m_stream.m_buffer.m_cur = local_1000.m_impl.m_stream.m_buffer.m_cur + 10;
      }
      pLVar5 = LogStream::operator<<(&local_1000.m_impl.m_stream,this);
      pcVar1 = (pLVar5->m_buffer).m_cur;
      ppcVar6 = &(pLVar5->m_buffer).m_cur;
      if (0xd < (uint)((int)ppcVar6 - (int)pcVar1)) {
        builtin_strncpy(pcVar1," stop looping",0xd);
        *ppcVar6 = *ppcVar6 + 0xd;
      }
      Logger::~Logger(&local_1000);
    }
    this->m_looping = false;
    return;
  }
  __assert_fail("!m_looping",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                ,0x59,"void sznet::net::EventLoop::loop()");
}

Assistant:

void EventLoop::loop()
{
	assert(!m_looping);
	assertInLoopThread();
	m_looping = true;
	m_quit = false;
	LOG_TRACE << "EventLoop " << this << " start looping";

	while (!m_quit)
	{
		m_activeChannels.clear();
		m_pollTime = Timestamp::now();
		// 优先处理到期timer
		m_timerQueue->expiredProcess(m_pollTime);
		// IO
		m_poller->poll(&m_activeChannels, m_timerQueue->earliestExpiredTime(m_pollTime, kPollTimeMs));
		++m_iteration;
		if (Logger::logLevel() <= Logger::TRACE)
		{
			printActiveChannels();
		}
		m_eventHandling = true;
		// 处理就绪事件
		for (Channel* channel : m_activeChannels)
		{
			m_currentActiveChannel = channel;
			m_currentActiveChannel->handleEvent(m_pollTime);
		}
		m_currentActiveChannel = nullptr;
		m_eventHandling = false;
		// 执行m_pendingFunctors中的任务回调
		// 这种设计使得IO线程也能执行一些计算任务，避免了IO线程在不忙时长期阻塞在IO multiplexing调用中
		// 这些任务显然必须是要求在IO线程中执行
		doPendingFunctors();
	}
	
	LOG_TRACE << "EventLoop " << this << " stop looping";
	m_looping = false;
}